

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_vfs_read(ma_vfs *pVFS,ma_vfs_file file,void *pDst,size_t sizeInBytes,size_t *pBytesRead
                     )

{
  _func_ma_result_ma_vfs_ptr_char_ptr_ma_uint32_ma_vfs_file_ptr *local_50;
  size_t bytesRead;
  ma_vfs *pmStack_40;
  ma_result result;
  ma_vfs_callbacks *pCallbacks;
  size_t *pBytesRead_local;
  size_t sizeInBytes_local;
  void *pDst_local;
  ma_vfs_file file_local;
  ma_vfs *pVFS_local;
  
  if (pBytesRead != (size_t *)0x0) {
    *pBytesRead = 0;
  }
  if (((pVFS == (ma_vfs *)0x0) || (file == (ma_vfs_file)0x0)) || (pDst == (void *)0x0)) {
    pVFS_local._4_4_ = MA_INVALID_ARGS;
  }
  else if (*(long *)((long)pVFS + 0x18) == 0) {
    pVFS_local._4_4_ = MA_NOT_IMPLEMENTED;
  }
  else {
    pmStack_40 = pVFS;
    pCallbacks = (ma_vfs_callbacks *)pBytesRead;
    pBytesRead_local = (size_t *)sizeInBytes;
    sizeInBytes_local = (size_t)pDst;
    pDst_local = file;
    file_local = pVFS;
    bytesRead._4_4_ = (**(code **)((long)pVFS + 0x18))(pVFS,file,pDst,sizeInBytes,&local_50);
    if (pCallbacks != (ma_vfs_callbacks *)0x0) {
      pCallbacks->onOpen = local_50;
    }
    if (((bytesRead._4_4_ == MA_SUCCESS) &&
        (local_50 == (_func_ma_result_ma_vfs_ptr_char_ptr_ma_uint32_ma_vfs_file_ptr *)0x0)) &&
       (pBytesRead_local != (size_t *)0x0)) {
      bytesRead._4_4_ = MA_AT_END;
    }
    pVFS_local._4_4_ = bytesRead._4_4_;
  }
  return pVFS_local._4_4_;
}

Assistant:

MA_API ma_result ma_vfs_read(ma_vfs* pVFS, ma_vfs_file file, void* pDst, size_t sizeInBytes, size_t* pBytesRead)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;
    ma_result result;
    size_t bytesRead;

    if (pBytesRead != NULL) {
        *pBytesRead = 0;
    }

    if (pVFS == NULL || file == NULL || pDst == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onRead == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pCallbacks->onRead(pVFS, file, pDst, sizeInBytes, &bytesRead);

    if (pBytesRead != NULL) {
        *pBytesRead = bytesRead;
    }

    if (result == MA_SUCCESS && bytesRead == 0 && sizeInBytes > 0) {
        result  = MA_AT_END;
    }

    return result;
}